

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

error_code llvm::sys::fs::getUniqueID(Twine Path,UniqueID *Result)

{
  error_category *peVar1;
  error_code eVar2;
  file_status fStack_58;
  
  fStack_58.fs_st_dev = 0;
  fStack_58.fs_st_nlinks = 0;
  fStack_58.fs_st_ino = 0;
  eVar2 = status(&Path,&fStack_58,true);
  peVar1 = eVar2._M_cat;
  if (eVar2._M_value == 0) {
    Result->Device = fStack_58.fs_st_dev;
    Result->File = fStack_58.fs_st_ino;
    peVar1 = (error_category *)std::_V2::system_category();
  }
  eVar2._4_4_ = 0;
  eVar2._M_cat = peVar1;
  return eVar2;
}

Assistant:

std::error_code getUniqueID(const Twine Path, UniqueID &Result) {
  file_status Status;
  std::error_code EC = status(Path, Status);
  if (EC)
    return EC;
  Result = Status.getUniqueID();
  return std::error_code();
}